

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O3

void __thiscall celero::TestVector::push_back(TestVector *this,shared_ptr<celero::Benchmark> *x)

{
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
  __mutex;
  undefined8 uVar1;
  int iVar2;
  
  __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
       .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)
                             __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                             _M_head_impl);
  if (iVar2 == 0) {
    std::
    vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>
    ::push_back((vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>
                 *)((long)(this->pimpl)._pimpl._M_t.
                          super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
                          .super__Head_base<0UL,_celero::TestVector::Impl_*,_false> + 0x28),x);
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl);
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl);
  _Unwind_Resume(uVar1);
}

Assistant:

void TestVector::push_back(std::shared_ptr<Benchmark> x)
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);
	this->pimpl->testVector.push_back(x);
}